

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Reserve
          (RepeatedField<unsigned_int> *this,int new_size)

{
  ulong num_elements;
  int size;
  int iVar1;
  uint *puVar2;
  Arena *this_00;
  LogMessage *pLVar3;
  char *pcVar4;
  Rep *rep;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->total_size_ < new_size) {
    if (this->total_size_ < 1) {
      rep = (Rep *)0x0;
    }
    else {
      puVar2 = elements(this);
      rep = (Rep *)(puVar2 + -2);
    }
    this_00 = GetArena(this);
    iVar1 = internal::CalculateReserveSize(this->total_size_,new_size);
    if (iVar1 < 0) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x393);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (static_cast<size_t>(new_size)) <= ((std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element)): "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=(&local_61,pLVar3);
      internal::LogMessage::~LogMessage(&local_60);
    }
    num_elements = (long)iVar1 * 4 + 8;
    if (this_00 == (Arena *)0x0) {
      pcVar4 = (char *)operator_new(num_elements);
    }
    else {
      pcVar4 = Arena::CreateInternalRawArray<char>(this_00,num_elements);
    }
    *(Arena **)pcVar4 = this_00;
    size = this->total_size_;
    this->total_size_ = iVar1;
    this->arena_or_elements_ = pcVar4 + 8;
    elements(this);
    if (0 < this->current_size_) {
      puVar2 = elements(this);
      memcpy(puVar2,rep->elements,(long)this->current_size_ << 2);
    }
    InternalDeallocate(this,rep,size);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : nullptr;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32_t), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}